

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O3

bool embree::avx::OrientedDiscMiIntersectorK<4,_8,_true>::occluded
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  uint uVar8;
  Scene *pSVar9;
  Geometry *pGVar10;
  long lVar11;
  __int_type_conflict _Var12;
  RTCFilterFunctionN p_Var13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  RTCFilterFunctionNArguments local_250;
  undefined1 local_220 [32];
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [16];
  undefined1 local_190 [16];
  undefined4 local_180;
  undefined4 uStack_17c;
  undefined4 uStack_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  uint local_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  
  pSVar9 = context->scene;
  uVar24 = (ulong)(Disc->primIDs).field_0.i[0];
  pGVar10 = (pSVar9->geometries).items[Disc->sharedGeomID].ptr;
  lVar11 = *(long *)&pGVar10->field_0x58;
  _Var12 = pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar28 = *(undefined1 (*) [16])(lVar11 + _Var12 * uVar24);
  uVar23 = (ulong)(Disc->primIDs).field_0.i[1];
  auVar32 = *(undefined1 (*) [16])(lVar11 + _Var12 * uVar23);
  uVar25 = (ulong)(Disc->primIDs).field_0.i[2];
  auVar29 = *(undefined1 (*) [16])(lVar11 + _Var12 * uVar25);
  uVar26 = (ulong)(Disc->primIDs).field_0.i[3];
  auVar38 = *(undefined1 (*) [16])(lVar11 + _Var12 * uVar26);
  auVar41 = vunpcklps_avx(auVar28,auVar29);
  auVar34 = vunpckhps_avx(auVar28,auVar29);
  auVar28 = vunpcklps_avx(auVar32,auVar38);
  auVar35 = vunpckhps_avx(auVar32,auVar38);
  auVar19 = vunpcklps_avx(auVar41,auVar28);
  auVar18 = vunpckhps_avx(auVar41,auVar28);
  auVar20 = vunpcklps_avx(auVar34,auVar35);
  lVar11 = *(long *)&pGVar10[1].time_range.upper;
  p_Var13 = pGVar10[1].intersectionFilterN;
  auVar28 = *(undefined1 (*) [16])(lVar11 + uVar24 * (long)p_Var13);
  auVar32 = *(undefined1 (*) [16])(lVar11 + uVar23 * (long)p_Var13);
  auVar29 = *(undefined1 (*) [16])(lVar11 + uVar25 * (long)p_Var13);
  auVar38 = *(undefined1 (*) [16])(lVar11 + (long)p_Var13 * uVar26);
  auVar41 = vunpcklps_avx(auVar28,auVar29);
  auVar28 = vunpckhps_avx(auVar28,auVar29);
  auVar29 = vunpcklps_avx(auVar32,auVar38);
  auVar32 = vunpckhps_avx(auVar32,auVar38);
  local_190 = vunpcklps_avx(auVar28,auVar32);
  local_1b0 = vunpcklps_avx(auVar41,auVar29);
  local_1a0 = vunpckhps_avx(auVar41,auVar29);
  local_1f0 = vpshufd_avx(ZEXT416(Disc->sharedGeomID),0);
  fVar1 = *(float *)(ray + k * 4 + 0x20);
  auVar38._4_4_ = fVar1;
  auVar38._0_4_ = fVar1;
  auVar38._8_4_ = fVar1;
  auVar38._12_4_ = fVar1;
  fVar2 = *(float *)(ray + k * 4 + 0x40);
  auVar41._4_4_ = fVar2;
  auVar41._0_4_ = fVar2;
  auVar41._8_4_ = fVar2;
  auVar41._12_4_ = fVar2;
  fVar3 = *(float *)(ray + k * 4 + 0x80);
  fVar4 = *(float *)(ray + k * 4 + 0xa0);
  fVar5 = *(float *)(ray + k * 4 + 0xc0);
  auVar28._0_4_ = fVar3 * local_1b0._0_4_ + fVar4 * local_1a0._0_4_ + fVar5 * local_190._0_4_;
  auVar28._4_4_ = fVar3 * local_1b0._4_4_ + fVar4 * local_1a0._4_4_ + fVar5 * local_190._4_4_;
  auVar28._8_4_ = fVar3 * local_1b0._8_4_ + fVar4 * local_1a0._8_4_ + fVar5 * local_190._8_4_;
  auVar28._12_4_ = fVar3 * local_1b0._12_4_ + fVar4 * local_1a0._12_4_ + fVar5 * local_190._12_4_;
  auVar32 = vcmpps_avx(ZEXT416(0) << 0x20,auVar28,4);
  auVar43._8_4_ = 0x3f800000;
  auVar43._0_8_ = 0x3f8000003f800000;
  auVar43._12_4_ = 0x3f800000;
  auVar28 = vblendvps_avx(auVar43,auVar28,auVar32);
  auVar29 = vsubps_avx(auVar20,auVar41);
  auVar38 = vsubps_avx(auVar18,auVar38);
  fVar6 = *(float *)(ray + k * 4);
  auVar44._4_4_ = fVar6;
  auVar44._0_4_ = fVar6;
  auVar44._8_4_ = fVar6;
  auVar44._12_4_ = fVar6;
  auVar41 = vsubps_avx(auVar19,auVar44);
  auVar31._0_4_ =
       auVar38._0_4_ * local_1a0._0_4_ + auVar29._0_4_ * local_190._0_4_ +
       local_1b0._0_4_ * auVar41._0_4_;
  auVar31._4_4_ =
       auVar38._4_4_ * local_1a0._4_4_ + auVar29._4_4_ * local_190._4_4_ +
       local_1b0._4_4_ * auVar41._4_4_;
  auVar31._8_4_ =
       auVar38._8_4_ * local_1a0._8_4_ + auVar29._8_4_ * local_190._8_4_ +
       local_1b0._8_4_ * auVar41._8_4_;
  auVar31._12_4_ =
       auVar38._12_4_ * local_1a0._12_4_ + auVar29._12_4_ * local_190._12_4_ +
       local_1b0._12_4_ * auVar41._12_4_;
  local_1c0 = vdivps_avx(auVar31,auVar28);
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar29._4_4_ = uVar7;
  auVar29._0_4_ = uVar7;
  auVar29._8_4_ = uVar7;
  auVar29._12_4_ = uVar7;
  auVar28 = vcmpps_avx(auVar29,local_1c0,2);
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
  local_200._4_4_ = uVar7;
  local_200._0_4_ = uVar7;
  local_200._8_4_ = uVar7;
  local_200._12_4_ = uVar7;
  auVar29 = vcmpps_avx(local_1c0,local_200,2);
  auVar28 = vandps_avx(auVar29,auVar28);
  auVar29 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar29 = vpcmpgtd_avx(auVar29,_DAT_01f7fcf0);
  auVar28 = vandps_avx(auVar28,auVar29);
  auVar29 = auVar32 & auVar28;
  if ((((auVar29 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar29 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar29[0xf] < '\0') {
    auVar28 = vandps_avx(auVar32,auVar28);
    auVar41 = vunpckhps_avx(auVar34,auVar35);
    fVar14 = local_1c0._0_4_;
    fVar15 = local_1c0._4_4_;
    fVar16 = local_1c0._8_4_;
    fVar17 = local_1c0._12_4_;
    auVar35._0_4_ = fVar6 + fVar3 * fVar14;
    auVar35._4_4_ = fVar6 + fVar3 * fVar15;
    auVar35._8_4_ = fVar6 + fVar3 * fVar16;
    auVar35._12_4_ = fVar6 + fVar3 * fVar17;
    auVar36._0_4_ = fVar1 + fVar4 * fVar14;
    auVar36._4_4_ = fVar1 + fVar4 * fVar15;
    auVar36._8_4_ = fVar1 + fVar4 * fVar16;
    auVar36._12_4_ = fVar1 + fVar4 * fVar17;
    auVar39._0_4_ = fVar2 + fVar5 * fVar14;
    auVar39._4_4_ = fVar2 + fVar5 * fVar15;
    auVar39._8_4_ = fVar2 + fVar5 * fVar16;
    auVar39._12_4_ = fVar2 + fVar5 * fVar17;
    auVar32 = vsubps_avx(auVar35,auVar19);
    auVar29 = vsubps_avx(auVar36,auVar18);
    auVar38 = vsubps_avx(auVar39,auVar20);
    auVar34._0_4_ =
         auVar32._0_4_ * auVar32._0_4_ +
         auVar29._0_4_ * auVar29._0_4_ + auVar38._0_4_ * auVar38._0_4_;
    auVar34._4_4_ =
         auVar32._4_4_ * auVar32._4_4_ +
         auVar29._4_4_ * auVar29._4_4_ + auVar38._4_4_ * auVar38._4_4_;
    auVar34._8_4_ =
         auVar32._8_4_ * auVar32._8_4_ +
         auVar29._8_4_ * auVar29._8_4_ + auVar38._8_4_ * auVar38._8_4_;
    auVar34._12_4_ =
         auVar32._12_4_ * auVar32._12_4_ +
         auVar29._12_4_ * auVar29._12_4_ + auVar38._12_4_ * auVar38._12_4_;
    auVar32._0_4_ = auVar41._0_4_ * auVar41._0_4_;
    auVar32._4_4_ = auVar41._4_4_ * auVar41._4_4_;
    auVar32._8_4_ = auVar41._8_4_ * auVar41._8_4_;
    auVar32._12_4_ = auVar41._12_4_ * auVar41._12_4_;
    auVar32 = vcmpps_avx(auVar34,auVar32,1);
    auVar28 = vandps_avx(auVar32,auVar28);
    iVar21 = vmovmskps_avx(auVar28);
    if (iVar21 != 0) {
      auVar37 = ZEXT1264(ZEXT412(0)) << 0x20;
      local_1e0 = ZEXT1232(ZEXT412(0)) << 0x20;
      uVar24 = (ulong)(byte)iVar21;
      uVar22 = 1 << ((byte)k & 0x1f);
      auVar40 = ZEXT464(0) << 0x20;
      auVar42 = ZEXT3264(CONCAT428(0xff800000,
                                   CONCAT424(0xff800000,
                                             CONCAT420(0xff800000,
                                                       CONCAT416(0xff800000,
                                                                 CONCAT412(0xff800000,
                                                                           CONCAT48(0xff800000,
                                                                                                                                                                        
                                                  0xff800000ff800000)))))));
      do {
        local_250.hit = (RTCHitN *)&local_180;
        uVar23 = 0;
        if (uVar24 != 0) {
          for (; (uVar24 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
          }
        }
        uVar8 = *(uint *)(local_1f0 + uVar23 * 4);
        pGVar10 = (pSVar9->geometries).items[uVar8].ptr;
        if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
            return true;
          }
          local_120 = *(undefined4 *)(local_1e0 + uVar23 * 4);
          local_100 = *(undefined4 *)(local_1e0 + uVar23 * 4 + 0x10);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1c0 + uVar23 * 4);
          local_250.context = context->user;
          local_b0 = vpshufd_avx(ZEXT416(uVar8),0);
          local_e0 = (Disc->primIDs).field_0.i[uVar23];
          local_180 = *(undefined4 *)(local_1b0 + uVar23 * 4);
          uVar7 = *(undefined4 *)(local_1a0 + uVar23 * 4);
          local_160._4_4_ = uVar7;
          local_160._0_4_ = uVar7;
          local_160._8_4_ = uVar7;
          local_160._12_4_ = uVar7;
          local_160._16_4_ = uVar7;
          local_160._20_4_ = uVar7;
          local_160._24_4_ = uVar7;
          local_160._28_4_ = uVar7;
          uVar7 = *(undefined4 *)(local_190 + uVar23 * 4);
          local_140._4_4_ = uVar7;
          local_140._0_4_ = uVar7;
          local_140._8_4_ = uVar7;
          local_140._12_4_ = uVar7;
          local_140._16_4_ = uVar7;
          local_140._20_4_ = uVar7;
          local_140._24_4_ = uVar7;
          local_140._28_4_ = uVar7;
          uStack_17c = local_180;
          uStack_178 = local_180;
          uStack_174 = local_180;
          uStack_170 = local_180;
          uStack_16c = local_180;
          uStack_168 = local_180;
          uStack_164 = local_180;
          uStack_11c = local_120;
          uStack_118 = local_120;
          uStack_114 = local_120;
          uStack_110 = local_120;
          uStack_10c = local_120;
          uStack_108 = local_120;
          uStack_104 = local_120;
          uStack_fc = local_100;
          uStack_f8 = local_100;
          uStack_f4 = local_100;
          uStack_f0 = local_100;
          uStack_ec = local_100;
          uStack_e8 = local_100;
          uStack_e4 = local_100;
          uStack_dc = local_e0;
          uStack_d8 = local_e0;
          uStack_d4 = local_e0;
          uStack_d0 = local_e0;
          uStack_cc = local_e0;
          uStack_c8 = local_e0;
          uStack_c4 = local_e0;
          local_c0 = local_b0;
          local_220 = vcmpps_avx(auVar37._0_32_,auVar37._0_32_,0xf);
          uStack_9c = (local_250.context)->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = (local_250.context)->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          local_280 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar22 & 0xf) << 4));
          local_270 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar22 >> 4) * 0x10);
          local_250.valid = (int *)local_280;
          local_250.geometryUserPtr = pGVar10->userPtr;
          local_250.N = 8;
          local_250.ray = (RTCRayN *)ray;
          if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar10->occlusionFilterN)(&local_250);
            auVar42 = ZEXT3264(CONCAT428(0xff800000,
                                         CONCAT424(0xff800000,
                                                   CONCAT420(0xff800000,
                                                             CONCAT416(0xff800000,
                                                                       CONCAT412(0xff800000,
                                                                                 CONCAT48(0xff800000
                                                                                          ,
                                                  0xff800000ff800000)))))));
            auVar40 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar37 = ZEXT1664(ZEXT816(0) << 0x40);
          }
          auVar28 = vpcmpeqd_avx(auVar40._0_16_,local_280);
          auVar32 = vpcmpeqd_avx(auVar40._0_16_,local_270);
          auVar33._16_16_ = auVar32;
          auVar33._0_16_ = auVar28;
          auVar33 = local_220 & ~auVar33;
          if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar33 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar33 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar33 >> 0x7f,0) == '\0') &&
                (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar33 >> 0xbf,0) == '\0') &&
              (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar33[0x1f]) {
            auVar27._0_4_ = auVar28._0_4_ ^ local_220._0_4_;
            auVar27._4_4_ = auVar28._4_4_ ^ local_220._4_4_;
            auVar27._8_4_ = auVar28._8_4_ ^ local_220._8_4_;
            auVar27._12_4_ = auVar28._12_4_ ^ local_220._12_4_;
            auVar27._16_4_ = auVar32._0_4_ ^ local_220._16_4_;
            auVar27._20_4_ = auVar32._4_4_ ^ local_220._20_4_;
            auVar27._24_4_ = auVar32._8_4_ ^ local_220._24_4_;
            auVar27._28_4_ = auVar32._12_4_ ^ local_220._28_4_;
          }
          else {
            p_Var13 = context->args->filter;
            if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var13)(&local_250);
              auVar42 = ZEXT3264(CONCAT428(0xff800000,
                                           CONCAT424(0xff800000,
                                                     CONCAT420(0xff800000,
                                                               CONCAT416(0xff800000,
                                                                         CONCAT412(0xff800000,
                                                                                   CONCAT48(
                                                  0xff800000,0xff800000ff800000)))))));
              auVar40 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar37 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            auVar28 = vpcmpeqd_avx(auVar40._0_16_,local_280);
            auVar32 = vpcmpeqd_avx(auVar40._0_16_,local_270);
            auVar30._16_16_ = auVar32;
            auVar30._0_16_ = auVar28;
            auVar27._0_4_ = auVar28._0_4_ ^ local_220._0_4_;
            auVar27._4_4_ = auVar28._4_4_ ^ local_220._4_4_;
            auVar27._8_4_ = auVar28._8_4_ ^ local_220._8_4_;
            auVar27._12_4_ = auVar28._12_4_ ^ local_220._12_4_;
            auVar27._16_4_ = auVar32._0_4_ ^ local_220._16_4_;
            auVar27._20_4_ = auVar32._4_4_ ^ local_220._20_4_;
            auVar27._24_4_ = auVar32._8_4_ ^ local_220._24_4_;
            auVar27._28_4_ = auVar32._12_4_ ^ local_220._28_4_;
            auVar33 = vblendvps_avx(auVar42._0_32_,*(undefined1 (*) [32])(local_250.ray + 0x100),
                                    auVar30);
            *(undefined1 (*) [32])(local_250.ray + 0x100) = auVar33;
          }
          if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar27 >> 0x7f,0) != '\0') ||
                (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar27 >> 0xbf,0) != '\0') ||
              (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar27[0x1f] < '\0') {
            return true;
          }
          *(undefined4 *)(ray + k * 4 + 0x100) = local_200._0_4_;
        }
        uVar24 = uVar24 ^ 1L << (uVar23 & 0x3f);
      } while (uVar24 != 0);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(
          const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom);
        const vbool<M> valid = Disc.valid();
        return DiscIntersectorK<M, K>::intersect(
            valid, ray, k, context, geom, pre, v0, n0,
            Occluded1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }